

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::RenderbufferAttachmentErrorsTest::iterate
          (RenderbufferAttachmentErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ContextType ctxType;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar7;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar6);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    PrepareObjects(this);
    (**(code **)(lVar7 + 0xf10))(this->m_fbo_invalid,0x8ce0,0x8d41,this->m_rbo_valid);
    bVar1 = ExpectError(this,0x502,false,true,false,true,true);
    (**(code **)(lVar7 + 0xf10))(this->m_fbo_valid,this->m_color_attachment_invalid,0x8d41);
    bVar2 = ExpectError(this,0x502,true,false,true,true,true);
    (**(code **)(lVar7 + 0xf10))(this->m_fbo_valid,this->m_attachment_invalid,0x8d41);
    bVar3 = ExpectError(this,0x500,true,false,false,true,true);
    (**(code **)(lVar7 + 0xf10))
              (this->m_fbo_valid,0x8ce0,this->m_renderbuffer_target_invalid,this->m_rbo_valid);
    bVar4 = ExpectError(this,0x500,true,true,false,false,true);
    (**(code **)(lVar7 + 0xf10))(this->m_fbo_valid,0x8ce0,0x8d41,this->m_rbo_invalid);
    bVar5 = ExpectError(this,0x502,true,true,false,true,false);
    Clean(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult RenderbufferAttachmentErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Prepare objects. */
		PrepareObjects();

		/* Invalid Framebuffer ID. */
		gl.namedFramebufferRenderbuffer(m_fbo_invalid, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo_valid);

		is_ok &= ExpectError(GL_INVALID_OPERATION, false, true, false, true, true);

		/* Invalid color attachment. */
		gl.namedFramebufferRenderbuffer(m_fbo_valid, m_color_attachment_invalid, GL_RENDERBUFFER, m_rbo_valid);

		is_ok &= ExpectError(GL_INVALID_OPERATION, true, false, true, true, true);

		/* Invalid attachment. */
		gl.namedFramebufferRenderbuffer(m_fbo_valid, m_attachment_invalid, GL_RENDERBUFFER, m_rbo_valid);

		is_ok &= ExpectError(GL_INVALID_ENUM, true, false, false, true, true);

		/* Invalid Renderbuffer Target. */
		gl.namedFramebufferRenderbuffer(m_fbo_valid, GL_COLOR_ATTACHMENT0, m_renderbuffer_target_invalid, m_rbo_valid);

		is_ok &= ExpectError(GL_INVALID_ENUM, true, true, false, false, true);

		/* Invalid Renderbuffer ID. */
		gl.namedFramebufferRenderbuffer(m_fbo_valid, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo_invalid);

		is_ok &= ExpectError(GL_INVALID_OPERATION, true, true, false, true, false);
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}